

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O0

int aq_add_adu(aq_t *q,adu_t *adu)

{
  int iVar1;
  adu_t *adu_local;
  aq_t *q_local;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x27a,"int aq_add_adu(aq_t *, adu_t *)");
  }
  if (adu == (adu_t *)0x0) {
    __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x27b,"int aq_add_adu(aq_t *, adu_t *)");
  }
  aq_enqueue_adu(q,adu);
  aq_insert_dummy_adus(q);
  iVar1 = aq_need_adu(q);
  if (iVar1 != 0) {
    aq_make_frame(q);
  }
  q_local._4_4_ = (uint)(iVar1 != 0);
  return q_local._4_4_;
}

Assistant:

int aq_add_adu(aq_t *q, adu_t *adu) {
  assert(q != NULL);
  assert(adu != NULL);

  aq_enqueue_adu(q, adu);
  aq_insert_dummy_adus(q);

  if (aq_need_adu(q)) {
    aq_make_frame(q);
    return 1;
  } else {
    return 0;
  }
}